

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

ssize_t archive_write_pax_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  ulong uVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 *__ptr;
  ulong uVar5;
  ulong length;
  
  pvVar1 = a->format_data;
  if (*(size_t *)((long)pvVar1 + 0x48) != 0) {
    iVar4 = __archive_write_output
                      (a,*(void **)((long)pvVar1 + 0x40),*(size_t *)((long)pvVar1 + 0x48));
    if ((iVar4 != 0) ||
       (iVar4 = __archive_write_nulls(a,*(size_t *)((long)pvVar1 + 0x58)), iVar4 != 0)) {
LAB_0027cf31:
      return (long)iVar4;
    }
    *(undefined8 *)((long)pvVar1 + 0x48) = 0;
  }
  if (s == 0) {
    uVar5 = 0;
  }
  else {
    __ptr = *(undefined8 **)((long)pvVar1 + 0x60);
    uVar5 = 0;
    do {
      while( true ) {
        if (__ptr == (undefined8 *)0x0) {
          return uVar5;
        }
        uVar2 = __ptr[3];
        if (uVar2 != 0) break;
        puVar3 = (undefined8 *)*__ptr;
        free(__ptr);
        *(undefined8 **)((long)pvVar1 + 0x60) = puVar3;
        __ptr = puVar3;
      }
      length = s - uVar5;
      if (uVar2 <= s - uVar5) {
        length = uVar2;
      }
      if (*(int *)(__ptr + 1) == 0) {
        iVar4 = __archive_write_output(a,(void *)((long)buff + uVar5),length);
        __ptr = *(undefined8 **)((long)pvVar1 + 0x60);
        __ptr[3] = __ptr[3] - length;
        if (iVar4 != 0) goto LAB_0027cf31;
      }
      else {
        __ptr[3] = uVar2 - length;
      }
      uVar5 = uVar5 + length;
    } while (uVar5 < s);
  }
  return uVar5;
}

Assistant:

static ssize_t
archive_write_pax_data(struct archive_write *a, const void *buff, size_t s)
{
	struct pax *pax;
	size_t ws;
	size_t total;
	int ret;

	pax = (struct pax *)a->format_data;

	/*
	 * According to GNU PAX format 1.0, write a sparse map
	 * before the body.
	 */
	if (archive_strlen(&(pax->sparse_map))) {
		ret = __archive_write_output(a, pax->sparse_map.s,
		    archive_strlen(&(pax->sparse_map)));
		if (ret != ARCHIVE_OK)
			return (ret);
		ret = __archive_write_nulls(a, pax->sparse_map_padding);
		if (ret != ARCHIVE_OK)
			return (ret);
		archive_string_empty(&(pax->sparse_map));
	}

	total = 0;
	while (total < s) {
		const unsigned char *p;

		while (pax->sparse_list != NULL &&
		    pax->sparse_list->remaining == 0) {
			struct sparse_block *sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}

		if (pax->sparse_list == NULL)
			return (total);

		p = ((const unsigned char *)buff) + total;
		ws = s - total;
		if (ws > pax->sparse_list->remaining)
			ws = (size_t)pax->sparse_list->remaining;

		if (pax->sparse_list->is_hole) {
			/* Current block is hole thus we do not write
			 * the body. */
			pax->sparse_list->remaining -= ws;
			total += ws;
			continue;
		}

		ret = __archive_write_output(a, p, ws);
		pax->sparse_list->remaining -= ws;
		total += ws;
		if (ret != ARCHIVE_OK)
			return (ret);
	}
	return (total);
}